

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

void __thiscall CLineInput::Activate(CLineInput *this,EInputPriority Priority)

{
  bool bVar1;
  EInputPriority in_ESI;
  CLineInput *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = IsActive((CLineInput *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if ((!bVar1) && ((s_ActiveInputPriority == NONE || ((int)s_ActiveInputPriority <= (int)in_ESI))))
  {
    if (s_pActiveInput != (CLineInput *)0x0) {
      OnDeactivate((CLineInput *)0x1d5614);
    }
    s_pActiveInput = in_RDI;
    OnActivate((CLineInput *)0x1d562b);
    s_ActiveInputPriority = in_ESI;
  }
  return;
}

Assistant:

void CLineInput::Activate(EInputPriority Priority)
{
	if(IsActive())
		return;
	if(s_ActiveInputPriority != NONE && Priority < s_ActiveInputPriority)
		return; // do not replace a higher priority input
	if(s_pActiveInput)
		s_pActiveInput->OnDeactivate();
	s_pActiveInput = this;
	s_pActiveInput->OnActivate();
	s_ActiveInputPriority = Priority;
}